

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Storage SVar2;
  long lVar3;
  int iVar4;
  int extraout_EAX;
  TestNode *node;
  undefined8 *puVar5;
  long *plVar6;
  DrawTest *this_00;
  long *extraout_RAX;
  ulong *puVar7;
  IndexType type;
  IndexType type_00;
  undefined4 *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  string iterationDesc;
  string desc;
  string name;
  DrawTestSpec spec;
  long *local_2d8;
  undefined8 local_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  string local_2b8;
  string local_298;
  DrawMethod local_274;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  long *local_250;
  undefined8 local_248;
  long local_240;
  undefined8 uStack_238;
  string local_230;
  TestNode *local_210;
  IndexGroup *local_208;
  long local_200;
  DrawTestSpec local_1f8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_1f8);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_buffer","unaligned buffer");
  local_274 = this->m_method;
  local_1f8.apiType.m_bits = 3;
  local_1f8.primitive = PRIMITIVE_TRIANGLES;
  local_1f8.primitiveCount = 5;
  local_1f8.indexType = INDEXTYPE_LAST;
  local_1f8.indexPointerOffset = 0;
  local_1f8.indexStorage = STORAGE_LAST;
  local_1f8.first = 0;
  local_1f8.indexMin = 0;
  local_1f8.indexMax = 0;
  local_1f8.instanceCount = 1;
  local_1f8.drawMethod = local_274;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_1f8.attribs,2);
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &(local_1f8.attribs.
     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
     ._M_impl.super__Vector_impl_data._M_start)->storage = &DAT_100000001;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 4;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].inputType = INPUTTYPE_FLOAT;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_1f8.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  *(undefined1 **)
   &local_1f8.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].outputType = &DAT_100000001;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].usage = USAGE_STATIC_DRAW;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].componentCount = 2;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 0;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = false;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  local_1f8.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
  tcu::TestNode::addChild((TestNode *)this,node);
  puVar8 = &DAT_01c6c77c;
  lVar11 = 0;
  local_210 = node;
  local_208 = this;
  do {
    local_1a8 = &local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"index_","");
    uVar1 = (&DAT_01c6c774)[lVar11 * 6];
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_2b8,(DrawTestSpec *)(ulong)uVar1,type);
    uVar9 = 0xf;
    if (local_1a8 != &local_198) {
      uVar9 = local_198;
    }
    if (uVar9 < local_2b8._M_string_length + local_1a0) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        uVar10 = local_2b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_2b8._M_string_length + local_1a0) goto LAB_013b74bd;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_013b74bd:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_2b8._M_dataplus._M_p)
      ;
    }
    local_250 = &local_240;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_240 = *plVar6;
      uStack_238 = puVar5[3];
    }
    else {
      local_240 = *plVar6;
      local_250 = (long *)*puVar5;
    }
    local_248 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"index ","");
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_298,(DrawTestSpec *)(ulong)uVar1,type_00);
    uVar9 = 0xf;
    if (local_270 != local_260) {
      uVar9 = local_260[0];
    }
    if (uVar9 < local_298._M_string_length + local_268) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar10 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_298._M_string_length + local_268) goto LAB_013b75de;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_013b75de:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_298._M_dataplus._M_p)
      ;
    }
    local_2d8 = &local_2c8;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_2c8 = *plVar6;
      uStack_2c0 = puVar5[3];
    }
    else {
      local_2c8 = *plVar6;
      local_2d8 = (long *)*puVar5;
    }
    local_2d0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_1a8 = &local_198;
    puVar7 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar7) {
      local_198 = *puVar7;
      lStack_190 = plVar6[3];
    }
    else {
      local_198 = *puVar7;
      local_1a8 = (ulong *)*plVar6;
    }
    local_1a0 = plVar6[1];
    *plVar6 = (long)puVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    SVar2 = (&DAT_01c6c770)[lVar11 * 6];
    local_200 = lVar11;
    deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
              (&local_230,(DrawTestSpec *)(ulong)SVar2,(Storage)local_1a0);
    uVar9 = 0xf;
    if (local_1a8 != &local_198) {
      uVar9 = local_198;
    }
    if (uVar9 < local_230._M_string_length + local_1a0) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        uVar10 = local_230.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_230._M_string_length + local_1a0) goto LAB_013b7721;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_013b7721:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_230._M_dataplus._M_p)
      ;
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    puVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_2b8.field_2._M_allocated_capacity = *puVar7;
      local_2b8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *puVar7;
      local_2b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_2b8._M_string_length = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)puVar7 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
    this_00 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (this_00,(local_208->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
               ,((local_208->super_TestCaseGroup).m_context)->m_renderCtx,(char *)local_250,
               local_2b8._M_dataplus._M_p);
    local_1f8.indexType = (&DAT_01c6c774)[lVar11 * 6];
    local_1f8.indexStorage = SVar2;
    if ((local_274 == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX) ||
       (local_274 == DRAWMETHOD_DRAWELEMENTS_RANGED)) {
      local_1f8.indexMin = 0;
      local_1f8.indexMax = 0x37;
    }
    lVar11 = 0;
    do {
      iVar4 = puVar8[lVar11];
      if (iVar4 == -1) break;
      local_270 = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"offset ","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar9 = 0xf;
      if (local_270 != local_260) {
        uVar9 = local_260[0];
      }
      if (uVar9 < local_298._M_string_length + local_268) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar10 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_298._M_string_length + local_268) goto LAB_013b793f;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_270);
      }
      else {
LAB_013b793f:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_270,(ulong)local_298._M_dataplus._M_p);
      }
      local_2d8 = &local_2c8;
      plVar6 = puVar5 + 2;
      if ((long *)*puVar5 == plVar6) {
        local_2c8 = *plVar6;
        uStack_2c0 = puVar5[3];
      }
      else {
        local_2c8 = *plVar6;
        local_2d8 = (long *)*puVar5;
      }
      local_2d0 = puVar5[1];
      *puVar5 = plVar6;
      puVar5[1] = 0;
      *(undefined1 *)plVar6 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_270 != local_260) {
        operator_delete(local_270,local_260[0] + 1);
      }
      local_1f8.indexPointerOffset = iVar4;
      deqp::gls::DrawTest::addIteration(this_00,&local_1f8,(char *)local_2d8);
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,local_2c8 + 1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    tcu::TestNode::addChild(local_210,(TestNode *)this_00);
    lVar3 = local_200;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    plVar6 = &local_240;
    if (local_250 != plVar6) {
      operator_delete(local_250,local_240 + 1);
      plVar6 = extraout_RAX;
    }
    iVar4 = (int)plVar6;
    lVar11 = lVar3 + 1;
    puVar8 = puVar8 + 6;
    if (lVar3 != 0) {
      if (local_1f8.attribs.
          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        iVar4 = extraout_EAX;
      }
      return iVar4;
    }
  } while( true );
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_INT,	false,	{ 2, 3, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* const	unalignedBufferGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_buffer", "unaligned buffer");
	const bool					isRangedMethod			= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED || m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX);

	genBasicSpec(spec, m_method);

	this->addChild(unalignedBufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];

		DE_ASSERT(indexTest.storage != gls::DrawTestSpec::STORAGE_USER);
		DE_ASSERT(!indexTest.aligned);
		tcu::TestCaseGroup*				group		= unalignedBufferGroup;

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		if (isRangedMethod)
		{
			spec.indexMin = 0;
			spec.indexMax = 55;
		}

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
				  spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}